

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop.cc
# Opt level: O3

void __thiscall verona::track::gen(track *this,Location *loc)

{
  pointer psVar1;
  map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
  *this_00;
  mapped_type_conflict *pmVar2;
  
  if (this->llvm == false) {
    psVar1 = (this->stack).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack).
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar1) {
      this_00 = &this->params;
    }
    else {
      this_00 = ::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,psVar1 + -1);
    }
    pmVar2 = ::std::
             map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
             ::operator[](this_00,loc);
    *pmVar2 = true;
  }
  return;
}

Assistant:

void gen(const Location& loc)
    {
      if (!llvm)
      {
        if (stack.empty())
          params[loc] = true;
        else
          lets[stack.back()][loc] = true;
      }
    }